

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cpp
# Opt level: O1

string * duckdb::FileSystem::GetWorkingDirectory_abi_cxx11_(void)

{
  char *__buf;
  char *pcVar1;
  IOException *this;
  string *in_RDI;
  string local_48;
  
  __buf = (char *)operator_new__(0x1000);
  switchD_0105b559::default(__buf,0,0x1000);
  pcVar1 = getcwd(__buf,0x1000);
  if (pcVar1 != (char *)0x0) {
    ::std::__cxx11::string::string((string *)in_RDI,__buf,(allocator *)&local_48);
    operator_delete__(__buf);
    return in_RDI;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Could not get working directory!","");
  IOException::IOException(this,&local_48);
  __cxa_throw(this,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string FileSystem::GetWorkingDirectory() {
	auto buffer = make_unsafe_uniq_array<char>(PATH_MAX);
	char *ret = getcwd(buffer.get(), PATH_MAX);
	if (!ret) {
		throw IOException("Could not get working directory!");
	}
	return string(buffer.get());
}